

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getDefaultRuleSetName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this)

{
  UBool UVar1;
  RuleBasedNumberFormat *this_local;
  UnicodeString *result;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  if ((this->defaultRuleSet == (NFRuleSet *)0x0) ||
     (UVar1 = NFRuleSet::isPublic(this->defaultRuleSet), UVar1 == '\0')) {
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    NFRuleSet::getName(this->defaultRuleSet,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getDefaultRuleSetName() const {
    UnicodeString result;
    if (defaultRuleSet && defaultRuleSet->isPublic()) {
        defaultRuleSet->getName(result);
    } else {
        result.setToBogus();
    }
    return result;
}